

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O2

void __thiscall
TorController::protocolinfo_cb
          (TorController *this,TorControlConnection *_conn,TorControlReply *reply)

{
  long lVar1;
  pointer pbVar2;
  pointer puVar3;
  string_view source_file;
  bool bVar4;
  iterator iVar5;
  TorController *pTVar6;
  size_type sVar7;
  Logger *pLVar8;
  Level LVar9;
  char *pcVar10;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar11;
  TorControlConnection *category;
  TorController *category_00;
  TorController *pTVar12;
  int source_line;
  int *in_R8;
  pointer s;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s_00;
  string_view str;
  string_view str_00;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  Span<unsigned_char> bytes;
  string_view logging_function_07;
  string torpassword;
  undefined1 local_188 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [2];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  l;
  string cookiefile;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  methods;
  undefined1 local_78 [16];
  _Head_base<0UL,_TorController_*,_false> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  m_vec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (reply->code != 0xfa) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file_01._M_len = 0x57;
      logging_function_01._M_str = "protocolinfo_cb";
      logging_function_01._M_len = 0xf;
      ::LogPrintf_<>(logging_function_01,source_file_01,0x265,ALL,Info,
                     "tor: Requesting protocol info failed\n");
      return;
    }
    goto LAB_0089340f;
  }
  methods._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &methods._M_t._M_impl.super__Rb_tree_header._M_header;
  methods._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  methods._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  methods._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cookiefile._M_dataplus._M_p = (pointer)&cookiefile.field_2;
  cookiefile._M_string_length = 0;
  cookiefile.field_2._M_local_buf[0] = '\0';
  pbVar2 = (reply->lines).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pcVar10 = (char *)_conn;
  category_00 = this;
  methods._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       methods._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (s = (reply->lines).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pTVar12 = (TorController *)methods._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
      s != pbVar2; s = s + 1) {
    SplitTorReplyLine(&l,s);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&l,
                            "AUTH");
    if (bVar4) {
      ParseTorReplyMapping
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&m._M_t,&l.second);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_188,"METHODS",(allocator<char> *)&m_vec);
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&m._M_t,(key_type *)local_188);
      std::__cxx11::string::~string((string *)local_188);
      if ((_Rb_tree_header *)iVar5._M_node != &m._M_t._M_impl.super__Rb_tree_header) {
        str_00._M_str = (char *)0x2c;
        str_00._M_len = *(size_t *)(iVar5._M_node + 2);
        util::SplitString_abi_cxx11_(&m_vec,(util *)iVar5._M_node[2]._M_parent,str_00,(char)in_R8);
        std::
        set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_188,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )m_vec.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )m_vec.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&methods._M_t,
                    (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_188);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_188);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&m_vec);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_188,"COOKIEFILE",(allocator<char> *)&m_vec);
      pcVar10 = (char *)local_188;
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&m._M_t,(key_type *)local_188);
      std::__cxx11::string::~string((string *)local_188);
      if ((_Rb_tree_header *)iVar5._M_node != &m._M_t._M_impl.super__Rb_tree_header) {
        pcVar10 = (char *)(iVar5._M_node + 2);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&cookiefile,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar10);
      }
LAB_0089287e:
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&m._M_t);
    }
    else {
      pcVar10 = "VERSION";
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &l,"VERSION");
      if (bVar4) {
        ParseTorReplyMapping
                  ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&m._M_t,&l.second);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_188,"Tor",(allocator<char> *)&m_vec);
        pcVar10 = (char *)local_188;
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&m._M_t,(key_type *)local_188);
        category = (TorControlConnection *)local_188;
        std::__cxx11::string::~string((string *)local_188);
        if (((_Rb_tree_header *)iVar5._M_node != &m._M_t._M_impl.super__Rb_tree_header) &&
           (bVar4 = ::LogAcceptCategory((LogFlags)category,(Level)pcVar10), bVar4)) {
          in_R8 = (int *)0x236;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
          ;
          source_file_00._M_len = 0x57;
          logging_function_00._M_str = "protocolinfo_cb";
          logging_function_00._M_len = 0xf;
          pcVar10 = "protocolinfo_cb";
          ::LogPrintf_<std::__cxx11::string>
                    (logging_function_00,source_file_00,0x236,TOR,Debug,
                     "Connected to Tor version %s\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (iVar5._M_node + 2));
        }
        goto LAB_0089287e;
      }
    }
    category_00 = (TorController *)&l;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&l);
  }
  while (pTVar12 != (TorController *)&methods._M_t._M_impl.super__Rb_tree_header) {
    bVar4 = ::LogAcceptCategory((LogFlags)category_00,(Level)pcVar10);
    if (bVar4) {
      in_R8 = (int *)0x23b;
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file_02._M_len = 0x57;
      logging_function_02._M_str = "protocolinfo_cb";
      logging_function_02._M_len = 0xf;
      pcVar10 = "protocolinfo_cb";
      ::LogPrintf_<std::__cxx11::string>
                (logging_function_02,source_file_02,0x23b,TOR,Debug,
                 "Supported authentication method: %s\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pTVar12->m_tor_control_center).field_2 + 8));
    }
    pTVar6 = (TorController *)std::_Rb_tree_increment((_Rb_tree_node_base *)pTVar12);
    category_00 = pTVar12;
    pTVar12 = pTVar6;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&l,"-torpassword",(allocator<char> *)local_188);
  std::__cxx11::string::string<std::allocator<char>>((string *)&m,"",(allocator<char> *)&m_vec);
  ArgsManager::GetArg(&torpassword,&gArgs,&l.first,(string *)&m);
  std::__cxx11::string::~string((string *)&m);
  std::__cxx11::string::~string((string *)&l);
  if (torpassword._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&l,"NULL",(allocator<char> *)&m);
    ppVar11 = &l;
    sVar7 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&methods,&ppVar11->first);
    LVar9 = (Level)ppVar11;
    ppVar11 = &l;
    std::__cxx11::string::~string((string *)ppVar11);
    if (sVar7 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&l,"SAFECOOKIE",(allocator<char> *)&m);
      ppVar11 = &l;
      sVar7 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&methods,&ppVar11->first);
      LVar9 = (Level)ppVar11;
      ppVar11 = &l;
      std::__cxx11::string::~string((string *)ppVar11);
      if (sVar7 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&l,"HASHEDPASSWORD",(allocator<char> *)&m);
        sVar7 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&methods,&l.first);
        std::__cxx11::string::~string((string *)&l);
        bVar4 = sVar7 == 0;
        source_line = bVar4 + 0x260 + (uint)bVar4;
        pcVar10 = 
        "tor: The only supported authentication mechanism left is password, but no password provided with -torpassword\n"
        ;
        if (bVar4) {
          pcVar10 = "tor: No supported authentication method\n";
        }
        goto LAB_00892c38;
      }
      bVar4 = ::LogAcceptCategory((LogFlags)ppVar11,LVar9);
      if (bVar4) {
        in_R8 = (int *)0x250;
        source_file_06._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_06._M_len = 0x57;
        logging_function_06._M_str = "protocolinfo_cb";
        logging_function_06._M_len = 0xf;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function_06,source_file_06,0x250,TOR,Debug,
                   "Using SAFECOOKIE authentication, reading cookie authentication from %s\n",
                   &cookiefile);
      }
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)&l,&cookiefile,auto_format);
      std::filesystem::__cxx11::path::path((path *)local_188,(path *)&l);
      std::filesystem::__cxx11::path::~path((path *)&l);
      ReadBinaryFile_abi_cxx11_
                ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&m,(path *)local_188,0x20);
      std::filesystem::__cxx11::path::~path((path *)local_188);
      if (m._M_t._M_impl._0_1_ == '\x01') {
        if (m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x20) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&l,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )m._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
                     (char *)(m._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 0x20),
                     (allocator_type *)local_188);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                    (&this->cookie,&l);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&l);
          local_188._0_8_ = local_188._0_8_ & 0xffffffffffffff00;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&l,0x20,local_188,
                     (allocator_type *)&m_vec);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                    (&this->clientNonce,&l);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&l);
          puVar3 = (this->clientNonce).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          bytes.m_size = (long)(this->clientNonce).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
          bytes.m_data = puVar3;
          GetRandBytes(bytes);
          puVar3 = (this->clientNonce).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          s_00.m_size = (long)(this->clientNonce).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar3;
          s_00.m_data = puVar3;
          HexStr_abi_cxx11_((string *)local_188,s_00);
          std::operator+(&l.first,"AUTHCHALLENGE SAFECOOKIE ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_188);
          local_78._0_8_ = authchallenge_cb;
          local_78._8_8_ = (_Elt_pointer)0x0;
          local_68._M_head_impl = this;
          std::function<void(TorControlConnection&,TorControlReply_const&)>::
          function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>,std::_Placeholder<2>))(TorControlConnection&,TorControlReply_const&)>,void>
                    ((function<void(TorControlConnection&,TorControlReply_const&)> *)&m_vec,
                     (_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>
                      *)local_78);
          TorControlConnection::Command(_conn,&l.first,(ReplyHandlerCB *)&m_vec);
          std::_Function_base::~_Function_base((_Function_base *)&m_vec);
          std::__cxx11::string::~string((string *)&l);
          ppVar11 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_188;
        }
        else {
          pLVar8 = LogInstance();
          bVar4 = BCLog::Logger::Enabled(pLVar8);
          if (!bVar4) goto LAB_00893002;
          l.first._M_dataplus._M_p = (pointer)&l.first.field_2;
          l.first._M_string_length = 0;
          l.first.field_2._M_local_buf[0] = '\0';
          tinyformat::format<std::__cxx11::string,int>
                    ((string *)local_188,
                     (tinyformat *)
                     "tor: Authentication cookie %s is not exactly %i bytes, as is required by the spec\n"
                     ,(char *)&cookiefile,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &TOR_COOKIE_SIZE,in_R8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&l.first,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_188);
          std::__cxx11::string::~string((string *)local_188);
          pLVar8 = LogInstance();
          local_188._0_8_ = (code *)0x57;
          local_188._8_8_ =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
          ;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
          ;
          source_file._M_len = 0x57;
          str._M_str = l.first._M_dataplus._M_p;
          str._M_len = l.first._M_string_length;
          logging_function._M_str = "protocolinfo_cb";
          logging_function._M_len = 0xf;
          BCLog::Logger::LogPrintStr(pLVar8,str,logging_function,source_file,0x25a,ALL,Info);
          ppVar11 = &l;
        }
        std::__cxx11::string::~string((string *)ppVar11);
      }
      else {
        source_file_07._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_07._M_len = 0x57;
        logging_function_07._M_str = "protocolinfo_cb";
        logging_function_07._M_len = 0xf;
        ::LogPrintf_<std::__cxx11::string>
                  (logging_function_07,source_file_07,0x25c,ALL,Info,
                   "tor: Authentication cookie %s could not be opened (check permissions)\n",
                   &cookiefile);
      }
LAB_00893002:
      ppVar11 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&m._M_t._M_impl.super__Rb_tree_header;
    }
    else {
      bVar4 = ::LogAcceptCategory((LogFlags)ppVar11,LVar9);
      if (bVar4) {
        source_file_04._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_04._M_len = 0x57;
        logging_function_04._M_str = "protocolinfo_cb";
        logging_function_04._M_len = 0xf;
        ::LogPrintf_<>(logging_function_04,source_file_04,0x24c,TOR,Debug,
                       "Using NULL authentication\n");
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&l,"AUTHENTICATE",(allocator<char> *)&m_vec);
      local_188._0_8_ = auth_cb;
      local_188._8_8_ = (char *)0x0;
      local_178[0]._0_8_ = this;
      std::function<void(TorControlConnection&,TorControlReply_const&)>::
      function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>,std::_Placeholder<2>))(TorControlConnection&,TorControlReply_const&)>,void>
                ((function<void(TorControlConnection&,TorControlReply_const&)> *)&m,
                 (_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>
                  *)local_188);
      TorControlConnection::Command(_conn,&l.first,(ReplyHandlerCB *)&m);
      std::_Function_base::~_Function_base((_Function_base *)&m);
      ppVar11 = &l;
    }
LAB_00893007:
    std::__cxx11::string::~string((string *)ppVar11);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&l,"HASHEDPASSWORD",(allocator<char> *)&m);
    ppVar11 = &l;
    sVar7 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&methods,&ppVar11->first);
    LVar9 = (Level)ppVar11;
    ppVar11 = &l;
    std::__cxx11::string::~string((string *)ppVar11);
    if (sVar7 != 0) {
      bVar4 = ::LogAcceptCategory((LogFlags)ppVar11,LVar9);
      if (bVar4) {
        source_file_03._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp"
        ;
        source_file_03._M_len = 0x57;
        logging_function_03._M_str = "protocolinfo_cb";
        logging_function_03._M_len = 0xf;
        ::LogPrintf_<>(logging_function_03,source_file_03,0x245,TOR,Debug,
                       "Using HASHEDPASSWORD authentication\n");
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&l,"\"",(allocator<char> *)local_188);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&m,"\\\"",(allocator<char> *)&m_vec);
      util::ReplaceAll(&torpassword,&l.first,(string *)&m);
      std::__cxx11::string::~string((string *)&m);
      std::__cxx11::string::~string((string *)&l);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m,
                     "AUTHENTICATE \"",&torpassword);
      std::operator+(&l.first,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &m,"\"");
      m_vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)auth_cb;
      m_vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      m_vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
      std::function<void(TorControlConnection&,TorControlReply_const&)>::
      function<std::_Bind<void(TorController::*(TorController*,std::_Placeholder<1>,std::_Placeholder<2>))(TorControlConnection&,TorControlReply_const&)>,void>
                ((function<void(TorControlConnection&,TorControlReply_const&)> *)local_188,
                 (_Bind<void_(TorController::*(TorController_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(TorControlConnection_&,_const_TorControlReply_&)>
                  *)&m_vec);
      TorControlConnection::Command(_conn,&l.first,(ReplyHandlerCB *)local_188);
      std::_Function_base::~_Function_base((_Function_base *)local_188);
      std::__cxx11::string::~string((string *)&l);
      ppVar11 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&m;
      goto LAB_00893007;
    }
    pcVar10 = 
    "tor: Password provided with -torpassword, but HASHEDPASSWORD authentication is not available\n"
    ;
    source_line = 0x249;
LAB_00892c38:
    source_file_05._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/torcontrol.cpp";
    source_file_05._M_len = 0x57;
    logging_function_05._M_str = "protocolinfo_cb";
    logging_function_05._M_len = 0xf;
    ::LogPrintf_<>(logging_function_05,source_file_05,source_line,ALL,Info,pcVar10);
  }
  std::__cxx11::string::~string((string *)&torpassword);
  std::__cxx11::string::~string((string *)&cookiefile);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&methods._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0089340f:
  __stack_chk_fail();
}

Assistant:

void TorController::protocolinfo_cb(TorControlConnection& _conn, const TorControlReply& reply)
{
    if (reply.code == 250) {
        std::set<std::string> methods;
        std::string cookiefile;
        /*
         * 250-AUTH METHODS=COOKIE,SAFECOOKIE COOKIEFILE="/home/x/.tor/control_auth_cookie"
         * 250-AUTH METHODS=NULL
         * 250-AUTH METHODS=HASHEDPASSWORD
         */
        for (const std::string &s : reply.lines) {
            std::pair<std::string,std::string> l = SplitTorReplyLine(s);
            if (l.first == "AUTH") {
                std::map<std::string,std::string> m = ParseTorReplyMapping(l.second);
                std::map<std::string,std::string>::iterator i;
                if ((i = m.find("METHODS")) != m.end()) {
                    std::vector<std::string> m_vec = SplitString(i->second, ',');
                    methods = std::set<std::string>(m_vec.begin(), m_vec.end());
                }
                if ((i = m.find("COOKIEFILE")) != m.end())
                    cookiefile = i->second;
            } else if (l.first == "VERSION") {
                std::map<std::string,std::string> m = ParseTorReplyMapping(l.second);
                std::map<std::string,std::string>::iterator i;
                if ((i = m.find("Tor")) != m.end()) {
                    LogDebug(BCLog::TOR, "Connected to Tor version %s\n", i->second);
                }
            }
        }
        for (const std::string &s : methods) {
            LogDebug(BCLog::TOR, "Supported authentication method: %s\n", s);
        }
        // Prefer NULL, otherwise SAFECOOKIE. If a password is provided, use HASHEDPASSWORD
        /* Authentication:
         *   cookie:   hex-encoded ~/.tor/control_auth_cookie
         *   password: "password"
         */
        std::string torpassword = gArgs.GetArg("-torpassword", "");
        if (!torpassword.empty()) {
            if (methods.count("HASHEDPASSWORD")) {
                LogDebug(BCLog::TOR, "Using HASHEDPASSWORD authentication\n");
                ReplaceAll(torpassword, "\"", "\\\"");
                _conn.Command("AUTHENTICATE \"" + torpassword + "\"", std::bind(&TorController::auth_cb, this, std::placeholders::_1, std::placeholders::_2));
            } else {
                LogPrintf("tor: Password provided with -torpassword, but HASHEDPASSWORD authentication is not available\n");
            }
        } else if (methods.count("NULL")) {
            LogDebug(BCLog::TOR, "Using NULL authentication\n");
            _conn.Command("AUTHENTICATE", std::bind(&TorController::auth_cb, this, std::placeholders::_1, std::placeholders::_2));
        } else if (methods.count("SAFECOOKIE")) {
            // Cookie: hexdump -e '32/1 "%02x""\n"'  ~/.tor/control_auth_cookie
            LogDebug(BCLog::TOR, "Using SAFECOOKIE authentication, reading cookie authentication from %s\n", cookiefile);
            std::pair<bool,std::string> status_cookie = ReadBinaryFile(fs::PathFromString(cookiefile), TOR_COOKIE_SIZE);
            if (status_cookie.first && status_cookie.second.size() == TOR_COOKIE_SIZE) {
                // _conn.Command("AUTHENTICATE " + HexStr(status_cookie.second), std::bind(&TorController::auth_cb, this, std::placeholders::_1, std::placeholders::_2));
                cookie = std::vector<uint8_t>(status_cookie.second.begin(), status_cookie.second.end());
                clientNonce = std::vector<uint8_t>(TOR_NONCE_SIZE, 0);
                GetRandBytes(clientNonce);
                _conn.Command("AUTHCHALLENGE SAFECOOKIE " + HexStr(clientNonce), std::bind(&TorController::authchallenge_cb, this, std::placeholders::_1, std::placeholders::_2));
            } else {
                if (status_cookie.first) {
                    LogPrintf("tor: Authentication cookie %s is not exactly %i bytes, as is required by the spec\n", cookiefile, TOR_COOKIE_SIZE);
                } else {
                    LogPrintf("tor: Authentication cookie %s could not be opened (check permissions)\n", cookiefile);
                }
            }
        } else if (methods.count("HASHEDPASSWORD")) {
            LogPrintf("tor: The only supported authentication mechanism left is password, but no password provided with -torpassword\n");
        } else {
            LogPrintf("tor: No supported authentication method\n");
        }
    } else {
        LogPrintf("tor: Requesting protocol info failed\n");
    }
}